

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

void __thiscall vk::BinaryRegistryDetail::BinaryIndexHash::BinaryIndexHash(BinaryIndexHash *this)

{
  BinaryIndexHashImpl *pBVar1;
  undefined8 *puVar2;
  
  de::MemPool::MemPool(&this->m_memPool,(deMemPoolUtil *)0x0,0);
  pBVar1 = BinaryIndexHashImpl_create((this->m_memPool).m_pool);
  this->m_hash = pBVar1;
  if (pBVar1 != (BinaryIndexHashImpl *)0x0) {
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = strcpy;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

BinaryIndexHash::BinaryIndexHash (void)
	: m_hash(BinaryIndexHashImpl_create(m_memPool.getRawPool()))
{
	if (!m_hash)
		throw std::bad_alloc();
}